

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxa_demangle.cpp
# Opt level: O3

char * __cxxabiv1::anon_unknown_0::parse_vector_type<__cxxabiv1::(anonymous_namespace)::Db>
                 (char *first,char *last,Db *db)

{
  char *first_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *paVar2;
  pointer psVar3;
  size_type sVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *__s;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  String num;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_f0;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_d0;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *local_90;
  undefined8 local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  local_80;
  value_type local_70;
  
  if ((long)last - (long)first < 4) {
    return first;
  }
  if (*first != 'D') {
    return first;
  }
  if (first[1] != 'v') {
    return first;
  }
  pcVar7 = first + 2;
  if ((byte)(first[2] - 0x31U) < 9) {
    pcVar5 = parse_number(pcVar7,last);
    if (pcVar5 == last) {
      return first;
    }
    if (*pcVar5 != '_') {
      return first;
    }
    first_00 = pcVar5 + 1;
    if (first_00 == last) {
      return first;
    }
    if (*first_00 == 'p') {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::
      basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
      ::_M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
                  *)&local_d0,pcVar7,pcVar7 + ((long)pcVar5 - (long)pcVar7));
      std::operator+(&local_f0,"pixel vector[",&local_d0);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::append(&local_f0,"]");
      local_70.first._M_string_length = local_f0._M_string_length;
      paVar1 = &local_f0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
           *)local_f0._M_dataplus._M_p == paVar1) {
        local_80._8_8_ = local_f0.field_2._8_8_;
        local_f0._M_dataplus._M_p = (pointer)&local_80;
      }
      local_f0._M_string_length = 0;
      local_f0.field_2._M_local_buf[0] = '\0';
      local_70.first._M_dataplus._M_p = local_f0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
           *)local_f0._M_dataplus._M_p == &local_80) {
        local_70.first.field_2._8_8_ = local_80._8_8_;
        local_70.first._M_dataplus._M_p = (pointer)&local_70.first.field_2;
      }
      local_70.second._M_dataplus._M_p = (pointer)&local_70.second.field_2;
      local_88 = 0;
      local_80._M_allocated_capacity =
           (ulong)(uint7)local_f0.field_2._M_allocated_capacity._1_7_ << 8;
      local_70.second._M_string_length = 0;
      local_70.second.field_2._M_local_buf[0] = '\0';
      local_f0._M_dataplus._M_p = (pointer)paVar1;
      local_90 = &local_80;
      std::
      vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ::push_back(&db->names,&local_70);
      string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
      ::~string_pair(&local_70);
      if (local_90 != &local_80) {
        free(local_90);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar1) {
        free(local_f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        free(local_d0._M_dataplus._M_p);
      }
      return pcVar5 + 2;
    }
    pcVar6 = parse_type<__cxxabiv1::(anonymous_namespace)::Db>(first_00,last,db);
    if (pcVar6 == first_00) {
      return first;
    }
    if ((db->names).
        super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (db->names).
        super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return first;
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::
    basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
    ::_M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
                *)&local_d0,pcVar7,pcVar7 + ((long)pcVar5 - (long)pcVar7));
    std::operator+(&local_f0," vector[",&local_d0);
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
    ::append(&local_f0,"]");
    sVar4 = local_f0._M_string_length;
    paVar2 = &local_70.first.field_2;
    paVar1 = &local_f0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
         *)local_f0._M_dataplus._M_p == paVar1) {
      local_70.first.field_2._8_8_ = local_f0.field_2._8_8_;
      local_f0._M_dataplus._M_p = (pointer)paVar2;
    }
    local_70.first._M_string_length = local_f0._M_string_length;
    local_f0._M_string_length = 0;
    local_f0.field_2._M_local_buf[0] = '\0';
    local_70.first._M_dataplus._M_p = local_f0._M_dataplus._M_p;
    local_f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
    ::_M_append(&(db->names).
                 super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].first,
                local_70.first._M_dataplus._M_p,sVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
         *)local_70.first._M_dataplus._M_p != paVar2) {
      free(local_70.first._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      free(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
         *)local_d0._M_dataplus._M_p == &local_d0.field_2) {
      return pcVar6;
    }
    free(local_d0._M_dataplus._M_p);
    return pcVar6;
  }
  paVar1 = &local_70.first.field_2;
  local_70.first._M_string_length = 0;
  local_70.first.field_2._M_allocated_capacity =
       local_70.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_70.first._M_dataplus._M_p = (pointer)paVar1;
  if ((first[2] != '_') &&
     (pcVar5 = parse_expression<__cxxabiv1::(anonymous_namespace)::Db>(pcVar7,last,db),
     pcVar5 != pcVar7)) {
    psVar3 = (db->names).
             super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((db->names).
        super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ._M_impl.super__Vector_impl_data._M_start == psVar3) goto LAB_001b52ef;
    string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
    ::move_full(&local_f0,psVar3 + -1);
    (anonymous_namespace)::parse_vector_type<__cxxabiv1::(anonymous_namespace)::Db>();
    pcVar7 = pcVar5;
  }
  if ((((pcVar7 != last) && (*pcVar7 == '_')) && (pcVar7 = pcVar7 + 1, pcVar7 != last)) &&
     ((pcVar5 = parse_type<__cxxabiv1::(anonymous_namespace)::Db>(pcVar7,last,db), pcVar5 != pcVar7
      && ((db->names).
          super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (db->names).
          super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
          ._M_impl.super__Vector_impl_data._M_finish)))) {
    std::operator+(&local_b0," vector[",&local_70.first);
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
    ::append(&local_b0,"]");
    sVar4 = local_b0._M_string_length;
    paVar2 = &local_b0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
         *)local_b0._M_dataplus._M_p == paVar2) {
      local_d0.field_2._8_8_ = local_b0.field_2._8_8_;
      local_b0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    local_d0._M_string_length = local_b0._M_string_length;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    local_d0._M_dataplus._M_p = local_b0._M_dataplus._M_p;
    __s = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
           *)local_b0._M_dataplus._M_p;
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
    ::_M_append(&(db->names).
                 super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].first,__s->_M_local_buf,sVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      free(local_d0._M_dataplus._M_p);
    }
    first = pcVar5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      free(local_b0._M_dataplus._M_p);
    }
  }
LAB_001b52ef:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
       *)local_70.first._M_dataplus._M_p != paVar1) {
    free(local_70.first._M_dataplus._M_p);
  }
  return first;
}

Assistant:

const char*
parse_vector_type(const char* first, const char* last, C& db)
{
    if (last - first > 3 && first[0] == 'D' && first[1] == 'v')
    {
        if ('1' <= first[2] && first[2] <= '9')
        {
            const char* t = parse_number(first+2, last);
            if (t == last || *t != '_')
                return first;
            const char* num = first + 2;
            size_t sz = static_cast<size_t>(t - num);
            if (++t != last)
            {
                if (*t != 'p')
                {
                    const char* t1 = parse_type(t, last, db);
                    if (t1 != t)
                    {
                        if (db.names.empty())
                            return first;
                        db.names.back().first += " vector[" + typename C::String(num, sz) + "]";
                        first = t1;
                    }
                }
                else
                {
                    ++t;
                    db.names.push_back("pixel vector[" + typename C::String(num, sz) + "]");
                    first = t;
                }
            }
        }
        else
        {
            typename C::String num;
            const char* t1 = first+2;
            if (*t1 != '_')
            {
                const char* t = parse_expression(t1, last, db);
                if (t != t1)
                {
                    if (db.names.empty())
                        return first;
                    num = db.names.back().move_full();
                    db.names.pop_back();
                    t1 = t;
                }
            }
            if (t1 != last && *t1 == '_' && ++t1 != last)
            {
                const char* t = parse_type(t1, last, db);
                if (t != t1)
                {
                    if (db.names.empty())
                        return first;
                    db.names.back().first += " vector[" + num + "]";
                    first = t;
                }
            }
        }
    }
    return first;
}